

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

LegacyScriptPubKeyMan * wallet::EnsureLegacyScriptPubKeyMan(CWallet *wallet,bool also_create)

{
  LegacyScriptPubKeyMan *pLVar1;
  UniValue *__return_storage_ptr__;
  long in_FS_OFFSET;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar1 = CWallet::GetLegacyScriptPubKeyMan(wallet);
  if (pLVar1 == (LegacyScriptPubKeyMan *)0x0 && also_create) {
    pLVar1 = CWallet::GetOrCreateLegacyScriptPubKeyMan(wallet);
  }
  if (pLVar1 == (LegacyScriptPubKeyMan *)0x0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Only legacy wallets are supported by this command","");
    JSONRPCError(__return_storage_ptr__,-4,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pLVar1;
  }
  __stack_chk_fail();
}

Assistant:

LegacyScriptPubKeyMan& EnsureLegacyScriptPubKeyMan(CWallet& wallet, bool also_create)
{
    LegacyScriptPubKeyMan* spk_man = wallet.GetLegacyScriptPubKeyMan();
    if (!spk_man && also_create) {
        spk_man = wallet.GetOrCreateLegacyScriptPubKeyMan();
    }
    if (!spk_man) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Only legacy wallets are supported by this command");
    }
    return *spk_man;
}